

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::DoConvert<double,long>(Thread *this,Ptr *out_trap)

{
  double dVar1;
  Value VVar2;
  
  VVar2 = Pop(this);
  dVar1 = wabt_convert_int64_to_double(VVar2.field_0.i64_);
  VVar2.field_0._8_8_ = 0;
  VVar2.field_0.f64_ = (f64)dVar1;
  Push(this,VVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}